

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

size_t Curl_strlen_url(char *url,_Bool relative)

{
  _Bool _Var1;
  byte *pbVar2;
  size_t sVar3;
  bool bVar4;
  undefined3 in_register_00000031;
  uint c;
  size_t sVar5;
  
  pbVar2 = (byte *)url;
  if (CONCAT31(in_register_00000031,relative) == 0) {
    pbVar2 = (byte *)find_host_sep(url);
  }
  bVar4 = true;
  sVar5 = 0;
  for (; *url != 0; url = (char *)((byte *)url + 1)) {
    if (url < pbVar2) {
      sVar5 = sVar5 + 1;
    }
    else {
      c = (uint)(byte)*url;
      if (c == 0x20) {
        if (bVar4) {
          sVar5 = sVar5 + 3;
          bVar4 = true;
        }
        else {
          sVar5 = sVar5 + 1;
          bVar4 = false;
        }
      }
      else {
        if (c == 0x3f) {
          bVar4 = false;
        }
        _Var1 = urlchar_needs_escaping(c);
        sVar3 = sVar5 + 2;
        if (!_Var1) {
          sVar3 = sVar5;
        }
        sVar5 = sVar3 + 1;
      }
    }
  }
  return sVar5;
}

Assistant:

size_t Curl_strlen_url(const char *url, bool relative)
{
  const unsigned char *ptr;
  size_t newlen = 0;
  bool left = TRUE; /* left side of the ? */
  const unsigned char *host_sep = (const unsigned char *) url;

  if(!relative)
    host_sep = (const unsigned char *) find_host_sep(url);

  for(ptr = (unsigned char *)url; *ptr; ptr++) {

    if(ptr < host_sep) {
      ++newlen;
      continue;
    }

    switch(*ptr) {
    case '?':
      left = FALSE;
      /* FALLTHROUGH */
    default:
      if(urlchar_needs_escaping(*ptr))
        newlen += 2;
      newlen++;
      break;
    case ' ':
      if(left)
        newlen += 3;
      else
        newlen++;
      break;
    }
  }
  return newlen;
}